

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

uchar * extra_next_record(ctl_extr_rec *ctl,int length)

{
  int in_ESI;
  int *in_RDI;
  uchar *p;
  int cur_len;
  uchar *in_stack_ffffffffffffffe8;
  int iVar1;
  
  iVar1 = in_RDI[8];
  extra_close_record((ctl_extr_rec *)CONCAT44(in_ESI,iVar1),
                     (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  *in_RDI = 1;
  if (*(long *)(in_RDI + 2) == 0) {
    extra_get_record((isoent *)CONCAT44(length,cur_len),(int *)p,in_RDI,
                     (int *)CONCAT44(in_ESI,iVar1));
  }
  else {
    *(long *)(in_RDI + 6) = *(long *)(in_RDI + 2) + (long)(iVar1 + 1);
    in_stack_ffffffffffffffe8 =
         extra_get_record((isoent *)CONCAT44(length,cur_len),(int *)p,in_RDI,
                          (int *)CONCAT44(in_ESI,iVar1));
    *(uchar **)(in_RDI + 2) = in_stack_ffffffffffffffe8 + -1;
  }
  in_RDI[8] = 0;
  if (in_RDI[10] - in_RDI[8] < in_ESI) {
    extra_next_record((ctl_extr_rec *)CONCAT44(in_ESI,iVar1),
                      (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  }
  return *(uchar **)(in_RDI + 2);
}

Assistant:

static unsigned char *
extra_next_record(struct ctl_extr_rec *ctl, int length)
{
	int cur_len = ctl->cur_len;/* save cur_len */

	/* Close the current extra record or Directory Record. */
	extra_close_record(ctl, RR_CE_SIZE);

	/* Get a next extra record. */
	ctl->use_extr = 1;
	if (ctl->bp != NULL) {
		/* Storing data into an extra record. */
		unsigned char *p;

		/* Save the pointer where a CE extension will be
		 * stored to. */
		ctl->ce_ptr = &ctl->bp[cur_len+1];
		p = extra_get_record(ctl->isoent,
		    &ctl->limit, &ctl->extr_off, &ctl->extr_loc);
		ctl->bp = p - 1;/* the base of bp offset is 1. */
	} else
		/* Calculating the size of an extra record. */
		(void)extra_get_record(ctl->isoent,
		    &ctl->limit, NULL, NULL);
	ctl->cur_len = 0;
	/* Check if an extra record is almost full.
	 * If so, get a next one. */
	if (extra_space(ctl) < length)
		(void)extra_next_record(ctl, length);

	return (ctl->bp);
}